

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O3

void Saig_MvManStop(Saig_MvMan_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Vec_Int_t *__ptr;
  int **__ptr_00;
  
  Aig_MmFixedStop(p->pMemStates,0);
  pVVar1 = p->vStates;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  __ptr = p->vXFlops;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      p->vXFlops->pArray = (int *)0x0;
      __ptr = p->vXFlops;
      if (__ptr == (Vec_Int_t *)0x0) goto LAB_006f9fee;
    }
    free(__ptr);
    p->vXFlops = (Vec_Int_t *)0x0;
  }
LAB_006f9fee:
  pVVar1 = p->vFlops;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vTired;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  __ptr_00 = p->pRegsValues;
  if (*__ptr_00 != (int *)0x0) {
    free(*__ptr_00);
    *p->pRegsValues = (int *)0x0;
    __ptr_00 = p->pRegsValues;
    if (__ptr_00 == (int **)0x0) goto LAB_006fa057;
  }
  free(__ptr_00);
  p->pRegsValues = (int **)0x0;
LAB_006fa057:
  if (p->nRegsValues != (int *)0x0) {
    free(p->nRegsValues);
    p->nRegsValues = (int *)0x0;
  }
  if (p->pRegsUndef != (int *)0x0) {
    free(p->pRegsUndef);
    p->pRegsUndef = (int *)0x0;
  }
  if (p->pAigOld != (Saig_MvObj_t *)0x0) {
    free(p->pAigOld);
    p->pAigOld = (Saig_MvObj_t *)0x0;
  }
  if (p->pTStates != (uint *)0x0) {
    free(p->pTStates);
    p->pTStates = (uint *)0x0;
  }
  if (p->pAigNew != (Saig_MvAnd_t *)0x0) {
    free(p->pAigNew);
    p->pAigNew = (Saig_MvAnd_t *)0x0;
  }
  if (p->pTNodes != (int *)0x0) {
    free(p->pTNodes);
    p->pTNodes = (int *)0x0;
  }
  if (p->pLevels != (uchar *)0x0) {
    free(p->pLevels);
  }
  free(p);
  return;
}

Assistant:

void Saig_MvManStop( Saig_MvMan_t * p )
{
    Aig_MmFixedStop( p->pMemStates, 0 );
    Vec_PtrFree( p->vStates );
    Vec_IntFreeP( &p->vXFlops );
    Vec_PtrFree( p->vFlops );
    Vec_PtrFree( p->vTired );
    ABC_FREE( p->pRegsValues[0] );
    ABC_FREE( p->pRegsValues );
    ABC_FREE( p->nRegsValues );
    ABC_FREE( p->pRegsUndef );
    ABC_FREE( p->pAigOld );
    ABC_FREE( p->pTStates );
    ABC_FREE( p->pAigNew );
    ABC_FREE( p->pTNodes );
    ABC_FREE( p->pLevels );
    ABC_FREE( p );
}